

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_logical_and_or(JSParseState *s,int op,int parse_flags)

{
  int iVar1;
  int iVar2;
  undefined4 in_EDX;
  int in_ESI;
  JSParseState *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  JSParseState *in_stack_00000008;
  int label1;
  JSParseState *in_stack_00000038;
  JSParseState *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  if (in_ESI == -0x5f) {
    iVar1 = js_parse_expr_binary(in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
    if (iVar1 != 0) {
      return -1;
    }
  }
  else {
    iVar1 = js_parse_logical_and_or
                      ((JSParseState *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffe4,
                       in_stack_ffffffffffffffe0);
    if (iVar1 != 0) {
      return -1;
    }
  }
  if ((in_RDI->token).val == in_ESI) {
    iVar1 = new_label((JSParseState *)0x19bd22);
    do {
      iVar2 = next_token(in_stack_00000038);
      if (iVar2 != 0) {
        return -1;
      }
      emit_op(in_RDI,(uint8_t)((uint)in_ESI >> 0x18));
      emit_goto(in_stack_ffffffffffffffd8,0,0x19bd73);
      emit_op(in_RDI,(uint8_t)((uint)in_ESI >> 0x18));
      if (in_ESI == -0x5f) {
        iVar2 = js_parse_expr_binary(in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
        if (iVar2 != 0) {
          return -1;
        }
      }
      else {
        iVar2 = js_parse_logical_and_or
                          ((JSParseState *)CONCAT44(in_ESI,in_EDX),iVar1,in_stack_ffffffffffffffe0);
        if (iVar2 != 0) {
          return -1;
        }
      }
    } while ((in_RDI->token).val == in_ESI);
    if ((in_RDI->token).val == -0x5a) {
      iVar1 = js_parse_error(in_RDI,"cannot mix ?? with && or ||");
      return iVar1;
    }
    emit_label(in_stack_ffffffffffffffd8,0);
  }
  return 0;
}

Assistant:

static __exception int js_parse_logical_and_or(JSParseState *s, int op,
                                               int parse_flags)
{
    int label1;

    if (op == TOK_LAND) {
        if (js_parse_expr_binary(s, 8, parse_flags))
            return -1;
    } else {
        if (js_parse_logical_and_or(s, TOK_LAND, parse_flags))
            return -1;
    }
    if (s->token.val == op) {
        label1 = new_label(s);

        for(;;) {
            if (next_token(s))
                return -1;
            emit_op(s, OP_dup);
            emit_goto(s, op == TOK_LAND ? OP_if_false : OP_if_true, label1);
            emit_op(s, OP_drop);

            if (op == TOK_LAND) {
                if (js_parse_expr_binary(s, 8, parse_flags & ~PF_ARROW_FUNC))
                    return -1;
            } else {
                if (js_parse_logical_and_or(s, TOK_LAND,
                                            parse_flags & ~PF_ARROW_FUNC))
                    return -1;
            }
            if (s->token.val != op) {
                if (s->token.val == TOK_DOUBLE_QUESTION_MARK)
                    return js_parse_error(s, "cannot mix ?? with && or ||");
                break;
            }
        }

        emit_label(s, label1);
    }
    return 0;
}